

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_emit_x86.h
# Opt level: O1

void emit_rr(ASMState *as,x86Op xo,Reg r1,Reg r2)

{
  MCode *pMVar1;
  byte *pbVar2;
  uint uVar3;
  byte bVar4;
  
  pMVar1 = as->mcp;
  pMVar1[-1] = ((byte)r2 & 7) + (char)r1 * '\b' | 0xc0;
  *(x86Op *)(pMVar1 + -5) = xo;
  pbVar2 = pMVar1 + (char)xo;
  uVar3 = r2 >> 3 & 1 | r1 >> 1 & 0x104;
  if (uVar3 != 0) {
    bVar4 = (byte)(r1 >> 0x10) | (byte)uVar3 | 0x40;
    if ((xo & XI_GROUP5) == 0xfc) {
      *pbVar2 = bVar4;
      bVar4 = (byte)(xo >> 8);
    }
    else if ((xo & 0xffffff) == 0x6600fd) {
      *pbVar2 = bVar4;
      bVar4 = 0x66;
    }
    pbVar2[-1] = bVar4;
    pbVar2 = pbVar2 + -1;
  }
  as->mcp = pbVar2;
  return;
}

Assistant:

static void emit_rr(ASMState *as, x86Op xo, Reg r1, Reg r2)
{
  MCode *p = as->mcp;
  as->mcp = emit_opm(xo, XM_REG, r1, r2, p, 0);
}